

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifyLANG.hpp
# Opt level: O1

void njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle::
     verifyLANG<ranges::ref_view<std::vector<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle::LegendreCoefficients,std::allocator<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle::LegendreCoefficients>>const>>
               (int LANG,
               ref_view<const_std::vector<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle::LegendreCoefficients,_std::allocator<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle::LegendreCoefficients>_>_>
               *sequence)

{
  pointer pLVar1;
  pointer pLVar2;
  long lVar3;
  undefined8 *puVar4;
  pointer pLVar5;
  long lVar6;
  
  pLVar1 = (sequence->rng_->
           super__Vector_base<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle::LegendreCoefficients,_std::allocator<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle::LegendreCoefficients>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pLVar2 = (sequence->rng_->
           super__Vector_base<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle::LegendreCoefficients,_std::allocator<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle::LegendreCoefficients>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  lVar3 = 0x48 - (long)pLVar1;
  do {
    lVar6 = lVar3;
    pLVar5 = pLVar1;
    if (LANG != 1) break;
    pLVar1 = pLVar5 + 1;
    lVar3 = lVar6 + -0x48;
  } while (pLVar5 != pLVar2);
  if (pLVar5 == pLVar2) {
    return;
  }
  tools::Log::error<char_const*>("All subsections must use the same LANG format option");
  tools::Log::info<char_const*,int,long>
            ("Expected LANG={} for the subsection with index={}",LANG,
             (-((long)&(sequence->rng_->
                       super__Vector_base<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle::LegendreCoefficients,_std::allocator<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle::LegendreCoefficients>_>
                       )._M_impl.super__Vector_impl_data._M_start[-1].super_Base.super_ListRecord.
                       metadata + lVar6) >> 3) * -0x71c71c71c71c71c7);
  puVar4 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar4 = getenv;
  __cxa_throw(puVar4,&std::exception::typeinfo,std::exception::~exception);
}

Assistant:

static void
verifyLANG( int LANG, const Array& sequence ) {

  auto compare = [LANG] ( const auto& entry )
                        { return entry.LANG() == LANG; };

  auto iter = ranges::cpp20::find_if_not( sequence, compare );

  if ( iter != ranges::cpp20::end( sequence ) ) {

    Log::error( "All subsections must use the same LANG format option" );
    Log::info( "Expected LANG={} for the subsection with index={}", LANG,
               ranges::cpp20::distance(
                   ranges::cpp20::begin( sequence ), iter ) );
    throw std::exception();
  }
}